

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadpool_scheduler.cpp
# Opt level: O1

void __thiscall
async::threadpool_scheduler::threadpool_scheduler
          (threadpool_scheduler *this,size_t num_threads,function<void_()> *prerun,
          function<void_()> *postrun)

{
  thread_data_t *ptVar1;
  _Head_base<0UL,_async::detail::threadpool_data_*,_false> this_00;
  pointer *__ptr;
  thread local_48;
  size_t local_40;
  int local_34;
  _Head_base<0UL,_async::detail::threadpool_data_*,_false> local_30;
  
  local_40 = num_threads;
  this_00._M_head_impl = (threadpool_data *)operator_new(0xb0);
  detail::threadpool_data::threadpool_data(this_00._M_head_impl,num_threads,prerun,postrun);
  (this->impl)._M_t.
  super___uniq_ptr_impl<async::detail::threadpool_data,_std::default_delete<async::detail::threadpool_data>_>
  ._M_t.
  super__Tuple_impl<0UL,_async::detail::threadpool_data_*,_std::default_delete<async::detail::threadpool_data>_>
  .super__Head_base<0UL,_async::detail::threadpool_data_*,_false>._M_head_impl =
       this_00._M_head_impl;
  local_34 = 0;
  local_30._M_head_impl = this_00._M_head_impl;
  std::thread::
  thread<void(&)(async::detail::threadpool_data*,unsigned_long,unsigned_long),async::detail::threadpool_data*,int,unsigned_long&,void>
            (&local_48,detail::recursive_spawn_worker_thread,&local_30._M_head_impl,&local_34,
             &local_40);
  ptVar1 = *(thread_data_t **)
            ((long)&((this->impl)._M_t.
                     super___uniq_ptr_impl<async::detail::threadpool_data,_std::default_delete<async::detail::threadpool_data>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_async::detail::threadpool_data_*,_std::default_delete<async::detail::threadpool_data>_>
                     .super__Head_base<0UL,_async::detail::threadpool_data_*,_false>._M_head_impl)->
                    thread_data + 8);
  if ((native_handle_type)(ptVar1->handle)._M_id == 0) {
    (ptVar1->handle)._M_id = local_48._M_id._M_thread;
    return;
  }
  std::terminate();
}

Assistant:

threadpool_scheduler::threadpool_scheduler(std::size_t num_threads,
                                           std::function<void()>&& prerun,
                                           std::function<void()>&& postrun)
    : impl(new detail::threadpool_data(num_threads, std::move(prerun), std::move(postrun)))
{
	// Start worker threads
	impl->thread_data[0].handle = std::thread(detail::recursive_spawn_worker_thread, impl.get(), 0, num_threads);
#ifdef BROKEN_JOIN_IN_DESTRUCTOR
	impl->thread_data[0].handle.detach();
#endif
}